

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::half>
          (Attribute *this,double t,half *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *pvVar2;
  optional<tinyusdz::value::half> local_40;
  optional<tinyusdz::value::half> local_3c;
  optional<tinyusdz::value::half> v;
  TimeSampleInterpolationType tinterp_local;
  half *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (half *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)&stack0xffffffffffffffc8,t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&stack0xffffffffffffffc8);
    if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
      primvar::PrimVar::get_value<tinyusdz::value::half>(&local_40,&this->_var);
      nonstd::optional_lite::optional<tinyusdz::value::half>::optional<tinyusdz::value::half,_0>
                (&local_3c,&local_40);
      nonstd::optional_lite::optional<tinyusdz::value::half>::~optional(&local_40);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_3c);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::half>::value(&local_3c);
        dst->value = pvVar2->value;
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<tinyusdz::value::half>::~optional(&local_3c);
      if (bVar1) goto LAB_007ac8c8;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<tinyusdz::value::half>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<tinyusdz::value::half>(this,dst);
    }
  }
LAB_007ac8c8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }